

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NProcessNodeList(xmlC14NCtxPtr ctx,xmlNodePtr cur)

{
  xmlC14NMode xVar1;
  xmlC14NVisibleNsStackPtr p_Var2;
  xmlNodePtr pxVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  xmlURIPtr uri;
  xmlChar **ppxVar9;
  xmlNodePtr pxVar10;
  xmlListPtr l;
  xmlAttrPtr pxVar11;
  xmlChar *pxVar12;
  void *pvVar13;
  byte bVar14;
  undefined7 uVar15;
  code *cur_00;
  char *pcVar16;
  xmlOutputBufferPtr out;
  xmlNs *pxVar17;
  _xmlNode **pp_Var18;
  _xmlNode *p_Var19;
  _xmlAttr **pp_Var20;
  uint uVar21;
  long lVar22;
  undefined1 *ns;
  int iVar23;
  bool bVar24;
  char *in_stack_ffffffffffffff78;
  xmlChar *local_78;
  xmlNodePtr local_70;
  xmlNodePtr local_68;
  int local_58;
  int local_54;
  undefined8 local_48;
  
  iVar5 = 0;
  cur_00 = (code *)cur;
LAB_00137490:
  iVar4 = 1;
  if ((cur == (xmlNodePtr)0x0) || (iVar5 < 0)) {
    return iVar5;
  }
  if (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0) {
    cur_00 = (code *)cur;
    iVar4 = (*ctx->is_visible_callback)(ctx->user_data,cur,cur->parent);
  }
  pxVar8 = (xmlChar *)(ulong)(cur->type - XML_ELEMENT_NODE);
  iVar23 = 0;
  iVar5 = 0;
  switch(pxVar8) {
  case (xmlChar *)0x0:
    pxVar17 = (xmlNs *)&cur->nsDef;
LAB_0013770f:
    do {
      pxVar17 = pxVar17->next;
      if (pxVar17 == (xmlNs *)0x0) goto LAB_00137767;
      iVar5 = xmlStrlen(pxVar17->href);
      if (0 < iVar5) {
        uri = xmlParseURI((char *)pxVar17->href);
        if (uri == (xmlURIPtr)0x0) {
          xmlC14NErrInternal("parsing namespace uri");
        }
        else {
          iVar5 = xmlStrlen((xmlChar *)uri->scheme);
          if (iVar5 != 0) {
            xmlFreeURI(uri);
            goto LAB_0013770f;
          }
          in_stack_ffffffffffffff78 = uri->scheme;
          cur_00 = (code *)0x0;
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                          (void *)0x0,(void *)0x0,0x15,0x7a3,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0
                          ,(char *)0x0,(char *)0x0,0,0,
                          "Relative namespace UR is invalid here : %s\n",in_stack_ffffffffffffff78);
          xmlFreeURI(uri);
        }
        pcVar16 = "checking for relative namespaces";
        goto LAB_00137823;
      }
    } while( true );
  case (xmlChar *)0x1:
    pcVar16 = "XML_ATTRIBUTE_NODE";
    goto LAB_00137755;
  case (xmlChar *)0x2:
  case (xmlChar *)0x3:
    iVar5 = iVar23;
    if ((iVar4 != 0) && (cur->content != (xmlChar *)0x0)) {
      cur_00 = (code *)0x3;
      pxVar7 = (xmlNodePtr)xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_TEXT);
      if (pxVar7 == (xmlNodePtr)0x0) {
        xmlC14NErrInternal("normalizing text node");
      }
      else {
        cur_00 = (code *)pxVar7;
        xmlOutputBufferWriteString(ctx->buf,(char *)pxVar7);
        (*xmlFree)(pxVar7);
      }
      iVar5 = -(uint)(pxVar7 == (xmlNodePtr)0x0);
    }
    break;
  case (xmlChar *)0x4:
    pcVar16 = "XML_ENTITY_REF_NODE";
    goto LAB_00137755;
  case (xmlChar *)0x5:
    pcVar16 = "XML_ENTITY_NODE";
    goto LAB_00137755;
  case (xmlChar *)0x6:
    iVar5 = iVar23;
    if (iVar4 != 0) {
      pcVar16 = "<?";
      if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
        pcVar16 = "\n<?";
      }
      xmlOutputBufferWriteString(ctx->buf,pcVar16);
      xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
      if ((cur->content != (xmlChar *)0x0) && (*cur->content != '\0')) {
        xmlOutputBufferWriteString(ctx->buf," ");
        cur_00 = (code *)0x2;
        pxVar8 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_PI);
        if (pxVar8 == (xmlChar *)0x0) {
          pcVar16 = "normalizing pi node";
LAB_00137823:
          xmlC14NErrInternal(pcVar16);
          iVar5 = -1;
          break;
        }
        xmlOutputBufferWriteString(ctx->buf,(char *)pxVar8);
        (*xmlFree)(pxVar8);
      }
      out = ctx->buf;
      if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
        cur_00 = (code *)"?>\n";
      }
      else {
        cur_00 = (code *)0x1eb441;
      }
LAB_00137b2f:
      xmlOutputBufferWriteString(out,(char *)cur_00);
      iVar5 = iVar23;
    }
    break;
  case (xmlChar *)0x7:
    iVar5 = iVar23;
    if ((iVar4 != 0) && (ctx->with_comments != 0)) {
      pcVar16 = "<!--";
      if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
        pcVar16 = "\n<!--";
      }
      xmlOutputBufferWriteString(ctx->buf,pcVar16);
      if (cur->content != (xmlChar *)0x0) {
        cur_00 = (code *)0x1;
        pxVar8 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_COMMENT);
        if (pxVar8 == (xmlChar *)0x0) {
          pcVar16 = "normalizing comment node";
          goto LAB_00137823;
        }
        xmlOutputBufferWriteString(ctx->buf,(char *)pxVar8);
        (*xmlFree)(pxVar8);
      }
      out = ctx->buf;
      if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
        cur_00 = (code *)"-->\n";
      }
      else {
        cur_00 = (code *)0x1e8b5e;
      }
      goto LAB_00137b2f;
    }
    break;
  case (xmlChar *)0x8:
  case (xmlChar *)0xa:
  case (xmlChar *)0xc:
    cur_00 = (code *)cur->children;
    if ((xmlNodePtr)cur_00 != (xmlNodePtr)0x0) {
      ctx->pos = XMLC14N_BEFORE_DOCUMENT_ELEMENT;
      ctx->parent_is_doc = 1;
      iVar5 = xmlC14NProcessNodeList(ctx,(xmlNodePtr)cur_00);
    }
    break;
  case (xmlChar *)0x9:
  case (xmlChar *)0xb:
  case (xmlChar *)0xd:
  case (xmlChar *)0xe:
  case (xmlChar *)0xf:
  case (xmlChar *)0x10:
  case (xmlChar *)0x12:
  case (xmlChar *)0x13:
    break;
  case (xmlChar *)0x11:
    pcVar16 = "XML_NAMESPACE_DECL";
LAB_00137755:
    xmlC14NErrInvalidNode(pcVar16,(char *)cur_00);
    goto LAB_0013775a;
  default:
    in_stack_ffffffffffffff78 =
         (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),cur->type);
    cur_00 = (code *)0x0;
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x15,0x7a2,XML_ERR_ERROR,(char *)0x0,0,"processing node",(char *)0x0
                    ,(char *)0x0,0,0,"Unknown node type %d found : %s\n",in_stack_ffffffffffffff78,
                    "processing node");
    goto LAB_0013775a;
  }
  goto switchD_001374d6_caseD_9;
LAB_00137767:
  p_Var2 = ctx->ns_rendered;
  if (p_Var2 == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam("saving namespaces stack");
    local_48 = 0;
    local_58 = 0;
  }
  else {
    local_48._0_4_ = p_Var2->nsCurEnd;
    local_48._4_4_ = p_Var2->nsPrevStart;
    local_58 = p_Var2->nsPrevEnd;
  }
  if (iVar4 == 0) {
    local_54 = 0;
  }
  else {
    local_54 = ctx->parent_is_doc;
    if (local_54 != 0) {
      ctx->pos = XMLC14N_INSIDE_DOCUMENT_ELEMENT;
      ctx->parent_is_doc = 0;
    }
    xmlOutputBufferWriteString(ctx->buf,"<");
    if ((cur->ns != (xmlNs *)0x0) && (iVar5 = xmlStrlen(cur->ns->prefix), 0 < iVar5)) {
      xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
      xmlOutputBufferWriteString(ctx->buf,":");
    }
    cur_00 = (code *)cur->name;
    xmlOutputBufferWriteString(ctx->buf,(char *)cur_00);
  }
  if (ctx->mode == XML_C14N_EXCLUSIVE_1_0) {
    if (cur->type == XML_ELEMENT_NODE) {
      cur_00 = xmlC14NNsCompare;
      local_68 = (xmlNodePtr)xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
      if (local_68 != (xmlNodePtr)0x0) {
        ppxVar9 = ctx->inclusive_ns_prefixes;
        if (ppxVar9 == (xmlChar **)0x0) {
          local_78 = (xmlChar *)0x0;
          bVar24 = false;
        }
        else {
          lVar22 = 0;
          local_78 = (xmlChar *)0x0;
          bVar24 = false;
          while (pxVar12 = *(xmlChar **)((long)ppxVar9 + lVar22), pxVar12 != (xmlChar *)0x0) {
            iVar5 = xmlStrEqual(pxVar12,(xmlChar *)"#default");
            if ((iVar5 != 0) || (iVar5 = xmlStrEqual(pxVar12,""), iVar5 != 0)) {
              bVar24 = true;
              pxVar12 = (xmlChar *)0x0;
            }
            pxVar7 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,pxVar12);
            if (((pxVar7 != (xmlNodePtr)0x0) &&
                (iVar5 = xmlC14NIsXmlNs((xmlNsPtr)pxVar7), iVar5 == 0)) &&
               ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                (iVar5 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar5 != 0)))) {
              iVar5 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar7);
              if (iVar4 != 0) {
                xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar7,cur);
              }
              if (iVar5 == 0) {
                xmlListInsert((xmlListPtr)local_68,pxVar7);
              }
              iVar5 = xmlStrlen((xmlChar *)pxVar7->children);
              pxVar8 = local_78;
              if (iVar5 == 0) {
                pxVar8 = (xmlChar *)0x1;
                local_78 = pxVar8;
              }
            }
            lVar22 = lVar22 + 8;
            ppxVar9 = ctx->inclusive_ns_prefixes;
          }
        }
        uVar6 = 0;
        uVar21 = 1;
        pxVar7 = (xmlNodePtr)cur->ns;
        if (pxVar7 == (xmlNodePtr)0x0) {
          pxVar7 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)0x0);
          uVar6 = 1;
          if (pxVar7 != (xmlNodePtr)0x0) goto LAB_00137c03;
          uVar6 = 1;
        }
        else {
LAB_00137c03:
          iVar5 = xmlC14NIsXmlNs((xmlNsPtr)pxVar7);
          if (iVar5 == 0) {
            if (iVar4 != 0) {
              if (((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                  (iVar5 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar5 != 0)) &&
                 (iVar5 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar7,ctx),
                 iVar5 == 0)) {
                xmlListInsert((xmlListPtr)local_68,pxVar7);
              }
              xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar7,cur);
            }
            iVar5 = xmlStrlen((xmlChar *)pxVar7->children);
            if (iVar5 == 0) {
              local_78._0_4_ = uVar21;
            }
            local_78 = (xmlChar *)(ulong)(uint)local_78;
          }
        }
        pp_Var18 = (_xmlNode **)&cur->properties;
        while( true ) {
          pxVar7 = *pp_Var18;
          if (pxVar7 == (xmlNodePtr)0x0) break;
          if (pxVar7->ns != (xmlNsPtr)0x0) {
            iVar5 = xmlC14NIsXmlNs(pxVar7->ns);
            if ((iVar5 == 0) &&
               ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                (iVar5 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar5 != 0)))) {
              iVar5 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,pxVar7->ns,ctx);
              xmlC14NVisibleNsStackAdd(ctx->ns_rendered,pxVar7->ns,cur);
              if ((iVar4 != 0) && (iVar5 == 0)) {
                xmlListInsert((xmlListPtr)local_68,pxVar7->ns);
              }
              iVar5 = xmlStrlen(pxVar7->ns->prefix);
              if (iVar5 == 0) {
                local_78._0_4_ = uVar21;
              }
              local_78 = (xmlChar *)(ulong)(uint)local_78;
            }
            else if ((pxVar7->ns != (xmlNs *)0x0) &&
                    ((iVar5 = xmlStrlen(pxVar7->ns->prefix), iVar5 == 0 &&
                     (iVar5 = xmlStrlen(pxVar7->ns->href), iVar5 == 0)))) {
              uVar6 = uVar21;
            }
          }
          pp_Var18 = &pxVar7->next;
        }
        uVar15 = (undefined7)((ulong)pxVar8 >> 8);
        pxVar8 = (xmlChar *)CONCAT71(uVar15,uVar6 == 0 || iVar4 == 0);
        if (((uint)local_78 == 0 && !bVar24) && (uVar6 != 0 && iVar4 != 0)) {
          xmlExcC14NProcessNamespacesAxis_ns_default._32_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default._40_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default._16_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default._24_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default._0_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default._8_8_ = 0;
          ns = xmlExcC14NProcessNamespacesAxis_ns_default;
          iVar5 = xmlExcC14NVisibleNsStackFind
                            (ctx->ns_rendered,(xmlNsPtr)xmlExcC14NProcessNamespacesAxis_ns_default,
                             ctx);
        }
        else {
          bVar14 = (iVar4 != 0 && (uint)local_78 == 0) & bVar24;
          pxVar8 = (xmlChar *)CONCAT71(uVar15,bVar14);
          if (bVar14 != 1) goto LAB_00137de6;
          xmlExcC14NProcessNamespacesAxis_ns_default_66._32_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default_66._40_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default_66._16_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default_66._24_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default_66._0_8_ = 0;
          xmlExcC14NProcessNamespacesAxis_ns_default_66._8_8_ = 0;
          ns = xmlExcC14NProcessNamespacesAxis_ns_default_66;
          iVar5 = xmlC14NVisibleNsStackFind
                            (ctx->ns_rendered,
                             (xmlNsPtr)xmlExcC14NProcessNamespacesAxis_ns_default_66);
        }
joined_r0x00137e5d:
        if (iVar5 == 0) {
          xmlC14NPrintNamespaces((xmlNsPtr)ns,ctx);
        }
        goto LAB_00137de6;
      }
      pcVar16 = "creating namespaces list (exc c14n)";
LAB_00137bb6:
      xmlC14NErrInternal(pcVar16);
    }
    else {
      pcVar16 = "processing namespaces axis (exc c14n)";
LAB_00137b1e:
      xmlC14NErrParam(pcVar16);
    }
    pcVar16 = "processing namespaces axis";
  }
  else {
    if (cur->type != XML_ELEMENT_NODE) {
      pcVar16 = "processing namespaces axis (c14n)";
      goto LAB_00137b1e;
    }
    cur_00 = xmlC14NNsCompare;
    local_68 = (xmlNodePtr)xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
    if (local_68 == (xmlNodePtr)0x0) {
      pcVar16 = "creating namespaces list (c14n)";
      goto LAB_00137bb6;
    }
    local_78 = (xmlChar *)0x0;
    for (p_Var19 = cur; p_Var19 != (xmlNodePtr)0x0; p_Var19 = p_Var19->parent) {
      pxVar7 = (xmlNodePtr)&p_Var19->nsDef;
      while (pxVar7 = (xmlNodePtr)pxVar7->_private, pxVar7 != (xmlNodePtr)0x0) {
        pxVar10 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)pxVar7->children);
        if (((pxVar10 == pxVar7) && (iVar5 = xmlC14NIsXmlNs((xmlNsPtr)pxVar7), iVar5 == 0)) &&
           ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
            (iVar5 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar5 != 0)))) {
          iVar5 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar7);
          if (iVar4 != 0) {
            xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar7,cur);
          }
          if (iVar5 == 0) {
            xmlListInsert((xmlListPtr)local_68,pxVar7);
          }
          iVar5 = xmlStrlen((xmlChar *)pxVar7->children);
          pxVar8 = local_78;
          if (iVar5 == 0) {
            pxVar8 = (xmlChar *)0x1;
            local_78 = pxVar8;
          }
        }
      }
    }
    if ((iVar4 != 0) && ((uint)local_78 == 0)) {
      xmlC14NProcessNamespacesAxis_ns_default._32_8_ = 0;
      xmlC14NProcessNamespacesAxis_ns_default._40_8_ = 0;
      xmlC14NProcessNamespacesAxis_ns_default._16_8_ = 0;
      xmlC14NProcessNamespacesAxis_ns_default._24_8_ = 0;
      xmlC14NProcessNamespacesAxis_ns_default._0_8_ = 0;
      xmlC14NProcessNamespacesAxis_ns_default._8_8_ = 0;
      ns = xmlC14NProcessNamespacesAxis_ns_default;
      iVar5 = xmlC14NVisibleNsStackFind
                        (ctx->ns_rendered,(xmlNsPtr)xmlC14NProcessNamespacesAxis_ns_default);
      goto joined_r0x00137e5d;
    }
LAB_00137de6:
    cur_00 = xmlC14NPrintNamespacesWalker;
    xmlListWalk((xmlListPtr)local_68,xmlC14NPrintNamespacesWalker,ctx);
    xmlListDelete((xmlListPtr)local_68);
    if (iVar4 != 0) {
      p_Var2 = ctx->ns_rendered;
      if (p_Var2 == (xmlC14NVisibleNsStackPtr)0x0) {
        xmlC14NErrParam("shifting namespaces stack");
      }
      else {
        pxVar8 = (xmlChar *)(ulong)(uint)p_Var2->nsCurEnd;
        p_Var2->nsPrevStart = p_Var2->nsPrevEnd;
        p_Var2->nsPrevEnd = p_Var2->nsCurEnd;
      }
    }
    if (cur->type == XML_ELEMENT_NODE) {
      cur_00 = xmlC14NAttrsCompare;
      l = xmlListCreate((xmlListDeallocator)0x0,xmlC14NAttrsCompare);
      if (l != (xmlListPtr)0x0) {
        xVar1 = ctx->mode;
        if (xVar1 == XML_C14N_1_1) {
          local_68 = (xmlNodePtr)0x0;
          local_70 = (xmlNodePtr)0x0;
          pxVar7 = (xmlNodePtr)0x0;
          pp_Var18 = (_xmlNode **)&cur->properties;
          while (pxVar10 = *pp_Var18, pxVar10 != (xmlNodePtr)0x0) {
            if ((iVar4 == 0) || (iVar5 = xmlC14NIsXmlAttr((xmlAttrPtr)pxVar10), iVar5 == 0)) {
LAB_00138027:
              if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                 (iVar5 = (*ctx->is_visible_callback)(ctx->user_data,pxVar10,cur), pxVar3 = local_70
                 , iVar5 != 0)) {
                xmlListInsert(l,pxVar10);
                pxVar3 = local_70;
              }
            }
            else if ((local_70 != (xmlNodePtr)0x0) ||
                    (iVar5 = xmlStrEqual(pxVar10->name,"lang"), pxVar3 = pxVar10, iVar5 == 0)) {
              if (pxVar7 == (xmlNodePtr)0x0) {
                iVar5 = xmlStrEqual(pxVar10->name,"space");
                bVar24 = iVar5 == 0;
                pxVar7 = (xmlNodePtr)0x0;
                if (!bVar24) {
                  pxVar7 = pxVar10;
                }
                pxVar8 = (xmlChar *)CONCAT71((int7)((ulong)pxVar8 >> 8),bVar24);
                if (!bVar24 || local_68 != (xmlNodePtr)0x0) {
                  pxVar7 = pxVar10;
                  pxVar3 = local_70;
                  if (iVar5 == 0) {
                    pxVar7 = (xmlNodePtr)0x0;
                    goto LAB_00138027;
                  }
                  goto LAB_0013804d;
                }
              }
              else if (local_68 != (xmlNodePtr)0x0) goto LAB_00138027;
              iVar5 = xmlStrEqual(pxVar10->name,"base");
              pxVar3 = local_70;
              local_68 = pxVar10;
              if (iVar5 == 0) {
                local_68 = (xmlNodePtr)0x0;
                goto LAB_00138027;
              }
            }
LAB_0013804d:
            local_70 = pxVar3;
            pp_Var18 = &pxVar10->next;
          }
          if (iVar4 != 0) {
            if ((local_70 != (xmlNodePtr)0x0) ||
               (local_70 = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"lang",pxVar8),
               local_70 != (xmlNodePtr)0x0)) {
              xmlListInsert(l,local_70);
            }
            if ((pxVar7 != (xmlNodePtr)0x0) ||
               (pxVar7 = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"space",pxVar8),
               pxVar7 != (xmlNodePtr)0x0)) {
              xmlListInsert(l,pxVar7);
            }
            if ((local_68 != (xmlNodePtr)0x0) ||
               (local_68 = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"base",pxVar8),
               local_68 != (xmlNodePtr)0x0)) {
              if (local_68->parent == (_xmlNode *)0x0) {
                xmlC14NErrParam("processing xml:base attribute");
              }
              else {
                local_70 = (xmlNodePtr)xmlNodeListGetString(ctx->doc,local_68->children,1);
                if (local_70 == (xmlNodePtr)0x0) {
LAB_00138379:
                  pcVar16 = "processing xml:base attribute - can\'t get attr value";
                }
                else {
                  p_Var19 = local_68->parent;
                  do {
                    do {
                      p_Var19 = p_Var19->parent;
                      if (((p_Var19 == (xmlNode *)0x0) ||
                          (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0)) ||
                         (iVar5 = (*ctx->is_visible_callback)
                                            (ctx->user_data,p_Var19,p_Var19->parent), iVar5 != 0)) {
                        iVar5 = xmlStrEqual((xmlChar *)local_70,"");
                        if (iVar5 != 0) {
                          (*xmlFree)(local_70);
                          goto LAB_00138385;
                        }
                        pxVar11 = xmlNewNsProp((xmlNodePtr)0x0,local_68->ns,"base",
                                               (xmlChar *)local_70);
                        (*xmlFree)(local_70);
                        if (pxVar11 == (xmlAttrPtr)0x0) {
                          pcVar16 = "processing xml:base attribute - can\'t construct attribute";
                          goto LAB_00138380;
                        }
                        xmlListInsert(l,pxVar11);
                        pxVar11->next = (_xmlAttr *)0x0;
                        goto LAB_00138388;
                      }
                      pxVar11 = xmlHasNsProp(p_Var19,"base",
                                             (xmlChar *)"http://www.w3.org/XML/1998/namespace");
                    } while (pxVar11 == (xmlAttrPtr)0x0);
                    pxVar8 = xmlNodeListGetString(ctx->doc,pxVar11->children,1);
                    if (pxVar8 == (xmlChar *)0x0) {
                      (*xmlFree)(local_70);
                      goto LAB_00138379;
                    }
                    uVar6 = xmlStrlen(pxVar8);
                    pxVar12 = pxVar8;
                    if (((1 < (int)uVar6) && (pxVar8[(ulong)uVar6 - 2] == '.')) &&
                       (pxVar12 = xmlStrcat(pxVar8,"/"), pxVar12 == (xmlChar *)0x0)) {
                      (*xmlFree)(pxVar8);
                      (*xmlFree)(local_70);
                      pcVar16 = "processing xml:base attribute - can\'t modify uri";
                      goto LAB_00138380;
                    }
                    pxVar8 = xmlBuildURI((xmlChar *)local_70,pxVar12);
                    (*xmlFree)(pxVar12);
                    (*xmlFree)(local_70);
                    local_70 = (xmlNodePtr)pxVar8;
                  } while (pxVar8 != (xmlChar *)0x0);
                  pcVar16 = "processing xml:base attribute - can\'t construct uri";
                }
LAB_00138380:
                xmlC14NErrInternal(pcVar16);
              }
            }
            goto LAB_00138385;
          }
LAB_001382a5:
          xmlListWalk(l,xmlC14NPrintAttrs,ctx);
          xmlFreePropList((xmlAttrPtr)0x0);
          xmlListDelete(l);
        }
        else {
          if (xVar1 == XML_C14N_EXCLUSIVE_1_0) {
            pp_Var18 = (_xmlNode **)&cur->properties;
            while (pxVar7 = *pp_Var18, pxVar7 != (xmlNodePtr)0x0) {
              if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                 (iVar5 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar5 != 0)) {
                xmlListInsert(l,pxVar7);
              }
              pp_Var18 = &pxVar7->next;
            }
LAB_00138385:
            pxVar11 = (xmlAttrPtr)0x0;
          }
          else {
            if (xVar1 != XML_C14N_1_0) goto LAB_00138385;
            pp_Var18 = (_xmlNode **)&cur->properties;
            while (pxVar7 = *pp_Var18, pxVar7 != (xmlNodePtr)0x0) {
              if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                 (iVar5 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar5 != 0)) {
                xmlListInsert(l,pxVar7);
              }
              pp_Var18 = &pxVar7->next;
            }
            if (iVar4 == 0) goto LAB_001382a5;
            pxVar7 = cur->parent;
            if (pxVar7 == (xmlNodePtr)0x0) {
              pxVar11 = (xmlAttrPtr)0x0;
            }
            else {
              if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                 (iVar5 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,pxVar7->parent),
                 p_Var19 = cur, iVar5 != 0)) goto LAB_00138385;
              while (p_Var19 = p_Var19->parent, p_Var19 != (_xmlNode *)0x0) {
                pp_Var20 = &p_Var19->properties;
                while (pxVar11 = *pp_Var20, pxVar11 != (xmlAttrPtr)0x0) {
                  iVar5 = xmlC14NIsXmlAttr(pxVar11);
                  if ((iVar5 != 0) && (pvVar13 = xmlListSearch(l,pxVar11), pvVar13 == (void *)0x0))
                  {
                    xmlListInsert(l,pxVar11);
                  }
                  pp_Var20 = &pxVar11->next;
                }
              }
              pxVar11 = (xmlAttrPtr)0x0;
            }
          }
LAB_00138388:
          xmlListWalk(l,xmlC14NPrintAttrs,ctx);
          xmlFreePropList(pxVar11);
          xmlListDelete(l);
          if (iVar4 != 0) {
            xmlOutputBufferWriteString(ctx->buf,">");
          }
        }
        cur_00 = (code *)cur->children;
        if (((xmlNodePtr)cur_00 == (xmlNodePtr)0x0) ||
           (iVar5 = xmlC14NProcessNodeList(ctx,(xmlNodePtr)cur_00), -1 < iVar5)) {
          if (iVar4 != 0) {
            xmlOutputBufferWriteString(ctx->buf,"</");
            if ((cur->ns != (xmlNs *)0x0) && (iVar5 = xmlStrlen(cur->ns->prefix), 0 < iVar5)) {
              xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
              xmlOutputBufferWriteString(ctx->buf,":");
            }
            xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
            cur_00 = (code *)0x1fa294;
            xmlOutputBufferWriteString(ctx->buf,">");
            if (local_54 != 0) {
              ctx->parent_is_doc = local_54;
              ctx->pos = XMLC14N_AFTER_DOCUMENT_ELEMENT;
            }
          }
          p_Var2 = ctx->ns_rendered;
          if (p_Var2 == (xmlC14NVisibleNsStackPtr)0x0) {
            xmlC14NErrParam("restoring namespaces stack");
          }
          else {
            p_Var2->nsCurEnd = (int)local_48;
            p_Var2->nsPrevStart = local_48._4_4_;
            p_Var2->nsPrevEnd = local_58;
          }
          iVar5 = 0;
          goto switchD_001374d6_caseD_9;
        }
        pcVar16 = "processing childrens list";
        goto LAB_00137f05;
      }
      xmlC14NErrInternal("creating attributes list");
    }
    else {
      xmlC14NErrParam("processing attributes axis");
    }
    pcVar16 = "processing attributes axis";
  }
LAB_00137f05:
  xmlC14NErrInternal(pcVar16);
LAB_0013775a:
  iVar5 = -1;
switchD_001374d6_caseD_9:
  cur = cur->next;
  goto LAB_00137490;
}

Assistant:

static int
xmlC14NProcessNodeList(xmlC14NCtxPtr ctx, xmlNodePtr cur)
{
    int ret;

    if (ctx == NULL) {
        xmlC14NErrParam("processing node list");
        return (-1);
    }

    for (ret = 0; cur != NULL && ret >= 0; cur = cur->next) {
        ret = xmlC14NProcessNode(ctx, cur);
    }
    return (ret);
}